

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnStream.cpp
# Opt level: O0

bool __thiscall
tfs::OutDnnStream::writeArray(OutDnnStream *this,unsigned_long *array,unsigned_long count)

{
  ulong uVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  long in_RSI;
  OutBinaryStream *in_RDI;
  bool arrayIsNull;
  bool local_1;
  
  uVar1 = OutBinaryStream::write(in_RDI,4,in_RDX,in_RCX);
  if ((uVar1 & 1) == 0) {
    local_1 = report_problem("Error",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnStream.cpp"
                             ,"writeArray",0xa8,"Unable to write matrix");
  }
  else {
    uVar1 = OutBinaryStream::write(in_RDI,(uint)(in_RSI == 0),__buf,in_RCX);
    if ((uVar1 & 1) == 0) {
      local_1 = report_problem("Error",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnStream.cpp"
                               ,"writeArray",0xac,"Unable to write array null / not null boolean");
    }
    else if (in_RSI == 0) {
      local_1 = true;
    }
    else {
      uVar1 = OutBinaryStream::write(in_RDI,(int)in_RDX,__buf_00,in_RCX);
      if ((uVar1 & 1) == 0) {
        local_1 = report_problem("Error",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnStream.cpp"
                                 ,"writeArray",0xb2,"Unable to write array count");
      }
      else {
        sVar2 = OutBinaryStream::write(in_RDI,(int)in_RSI,in_RDX,in_RCX);
        local_1 = (bool)((byte)sVar2 & 1);
      }
    }
  }
  return local_1;
}

Assistant:

bool
    OutDnnStream::writeArray( const unsigned long *array, const unsigned long count ) {
        if( !write( OBJECT_ARRAY_UNSIGNED_LONG )) {
            return log_error( "Unable to write matrix" );
        }
        const bool arrayIsNull = array == 0;
        if( !write( arrayIsNull )) {
            return log_error( "Unable to write array null / not null boolean" );
        }
        if( arrayIsNull ) {
            return true;            // Our work here is done.
        }
        if( !write( count )) {
            return log_error( "Unable to write array count" );
        }
        return write( array, count );
    }